

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O0

HRESULT __thiscall
BGParseManager::QueueBackgroundParse
          (BGParseManager *this,LPCUTF8 pszSrc,size_t cbLength,char16 *fullPath,
          DWORD *dwBgParseCookie)

{
  bool bVar1;
  DWORD DVar2;
  DWORD DVar3;
  HeapAllocator *alloc;
  BGParseWorkItem *this_00;
  JobProcessor *pJVar4;
  CriticalSection *cs;
  Tick local_b0;
  Tick now;
  AutoOptionalCriticalSection autoLock;
  TrackAllocData local_70;
  AutoNestedHandledExceptionType local_44;
  BGParseWorkItem *pBStack_40;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  BGParseWorkItem *workitem;
  HRESULT hr;
  DWORD *dwBgParseCookie_local;
  char16 *fullPath_local;
  size_t cbLength_local;
  LPCUTF8 pszSrc_local;
  BGParseManager *this_local;
  
  workitem._4_4_ = 0;
  if (cbLength == 0) {
    workitem._4_4_ = -0x7ff8ffa9;
  }
  else {
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_44,ExceptionType_DisableCheck);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_70,(type_info *)&BGParseWorkItem::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BGParseManager.cpp"
               ,0xb8);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_70);
    this_00 = (BGParseWorkItem *)new<Memory::HeapAllocator>(0xd0,alloc,0x350bd0);
    BGParseWorkItem::BGParseWorkItem(this_00,this,pszSrc,cbLength,fullPath);
    pBStack_40 = this_00;
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_44);
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    cs = JsUtil::JobProcessor::GetCriticalSection(pJVar4);
    AutoOptionalCriticalSection::AutoOptionalCriticalSection((AutoOptionalCriticalSection *)&now,cs)
    ;
    pJVar4 = JsUtil::JobManager::Processor((JobManager *)this);
    (*pJVar4->_vptr_JobProcessor[2])(pJVar4,pBStack_40,0);
    AutoOptionalCriticalSection::~AutoOptionalCriticalSection((AutoOptionalCriticalSection *)&now);
    DVar2 = BGParseWorkItem::GetCookie(pBStack_40);
    *dwBgParseCookie = DVar2;
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BgParsePhase);
    if (bVar1) {
      local_b0 = Js::Tick::Now();
      DVar2 = BGParseWorkItem::GetCookie(pBStack_40);
      DVar3 = GetCurrentThreadId();
      Js::Tick::ToMilliseconds(&local_b0);
      Output::Print(L"[BgParse: Start -- cookie: %04d on thread 0x%X at %.2f ms -- %s]\n",
                    (ulong)DVar2,(ulong)DVar3,fullPath);
    }
  }
  return workitem._4_4_;
}

Assistant:

HRESULT BGParseManager::QueueBackgroundParse(LPCUTF8 pszSrc, size_t cbLength, char16 *fullPath, DWORD* dwBgParseCookie)
{
    HRESULT hr = S_OK;
    if (cbLength > 0)
    {
        BGParseWorkItem* workitem;
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
            workitem = HeapNew(BGParseWorkItem, this, (const byte *)pszSrc, cbLength, fullPath);
        }

        // Add the job to the processor
        {
            AutoOptionalCriticalSection autoLock(Processor()->GetCriticalSection());
            Processor()->AddJob(workitem, false /*prioritize*/);
        }

        (*dwBgParseCookie) = workitem->GetCookie();

        if (PHASE_TRACE1(Js::BgParsePhase))
        {
            Js::Tick now = Js::Tick::Now();
            Output::Print(
                _u("[BgParse: Start -- cookie: %04d on thread 0x%X at %.2f ms -- %s]\n"),
                workitem->GetCookie(),
                ::GetCurrentThreadId(),
                now.ToMilliseconds(),
                fullPath
            );
        }
    }
    else
    {
        hr = E_INVALIDARG;
    }

    return hr;
}